

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFadds.c
# Opt level: O1

int Dtc_ObjComputeTruth_rec(Gia_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = pObj->Value;
  if (uVar1 == 0) {
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar1 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar1 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFadds.c"
                    ,0x92,"int Dtc_ObjComputeTruth_rec(Gia_Obj_t *)");
    }
    uVar1 = Dtc_ObjComputeTruth_rec(pObj + -(ulong)uVar1);
    uVar2 = Dtc_ObjComputeTruth_rec(pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    uVar1 = ((uint)((*(long *)pObj << 2) >> 0x3f) ^ uVar2) &
            ((int)*(long *)pObj * 4 >> 0x1f ^ uVar1);
    pObj->Value = uVar1;
  }
  return uVar1;
}

Assistant:

int Dtc_ObjComputeTruth_rec( Gia_Obj_t * pObj )
{
    int Truth0, Truth1;
    if ( pObj->Value )
        return pObj->Value;
    assert( Gia_ObjIsAnd(pObj) );
    Truth0 = Dtc_ObjComputeTruth_rec( Gia_ObjFanin0(pObj) );
    Truth1 = Dtc_ObjComputeTruth_rec( Gia_ObjFanin1(pObj) );
    return (pObj->Value = (Gia_ObjFaninC0(pObj) ? ~Truth0 : Truth0) & (Gia_ObjFaninC1(pObj) ? ~Truth1 : Truth1));
}